

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O2

HighsStatus
ipxBasicSolutionToHighsBasicSolution
          (HighsLogOptions *log_options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,IpxSolution *ipx_solution,
          HighsBasis *highs_basis,HighsSolution *highs_solution)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  pointer piVar7;
  pointer pHVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  pointer piVar13;
  pointer piVar14;
  pointer pdVar15;
  pointer pdVar16;
  pointer pcVar17;
  pointer pdVar18;
  pointer pdVar19;
  pointer pdVar20;
  ulong uVar21;
  ulong uVar22;
  HighsStatus HVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  HighsBasisStatus HVar29;
  uint uVar30;
  double dVar31;
  double dVar32;
  uint local_b4;
  vector<double,_std::allocator<double>_> row_activity;
  value_type_conflict1 local_38;
  
  this = &highs_solution->col_value;
  std::vector<double,_std::allocator<double>_>::resize(this,(long)lp->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&highs_solution->row_value,(long)lp->num_row_);
  this_00 = &highs_solution->col_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_00,(long)lp->num_col_);
  this_01 = &highs_solution->row_dual;
  std::vector<double,_std::allocator<double>_>::resize(this_01,(long)lp->num_row_);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&highs_basis->col_status,(long)lp->num_col_);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            (&highs_basis->row_status,(long)lp->num_row_);
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar26 = ipx_solution->num_row;
  iVar3 = lp->num_row_;
  if (iVar26 < iVar3) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&row_activity,(long)iVar3,&local_38);
  }
  uVar30 = lp->num_col_;
  piVar7 = (ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8 = (highs_basis->col_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  pdVar10 = (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pdVar11 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar13 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar27 = 0;
  uVar22 = 0;
  if (0 < (int)uVar30) {
    uVar22 = (ulong)uVar30;
  }
  for (; uVar27 != uVar22; uVar27 = uVar27 + 1) {
    switch(piVar7[uVar27]) {
    case 0:
      pHVar8[uVar27] = kBasic;
      pdVar11[uVar27] = pdVar9[uVar27];
      dVar32 = 0.0;
      goto LAB_00270a1f;
    case -3:
      pHVar8[uVar27] = kZero;
      break;
    case -2:
      pHVar8[uVar27] = kUpper;
      break;
    case -1:
      pHVar8[uVar27] = kLower;
      break;
    default:
      highsLogDev(log_options,kError,
                  "\nError in IPX conversion: Unrecognised value ipx_col_status[%2d] = %d\n",
                  uVar27 & 0xffffffff);
      highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                  (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar27],
                  (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar27]);
      highsLogDev(log_options,kError,
                  "Col %2d ipx_col_status[%2d] = %2d; x[%2d] = %11.4g; z[%2d] = %11.4g\n",
                  (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar27],
                  (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar27],uVar27 & 0xffffffff,
                  uVar27 & 0xffffffff,
                  (ulong)(uint)(ipx_solution->ipx_col_status).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar27],uVar27);
      highsLogUser(log_options,kError,"Unrecognised ipx_col_status value from IPX\n",uVar27);
      goto LAB_00270eb7;
    }
    pdVar11[uVar27] = pdVar9[uVar27];
    dVar32 = pdVar10[uVar27];
LAB_00270a1f:
    pdVar12[uVar27] = dVar32;
    if (iVar26 < iVar3) {
      iVar4 = piVar13[uVar27 + 1];
      piVar14 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar15 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar16 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar25 = (long)piVar13[uVar27]; lVar25 < iVar4; lVar25 = lVar25 + 1) {
        iVar5 = piVar14[lVar25];
        row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar5] =
             pdVar16[uVar27] * pdVar15[lVar25] +
             row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar5];
      }
    }
  }
  pdVar9 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar7 = (ipx_solution->ipx_row_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar11 = (rhs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (ipx_solution->ipx_col_value).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar15 = (ipx_solution->ipx_row_value).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pdVar16 = (ipx_solution->ipx_row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  pcVar17 = (constraint_type->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pHVar8 = (highs_basis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar18 = (highs_solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar19 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pdVar20 = (ipx_solution->ipx_col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  piVar13 = (ipx_solution->ipx_col_status).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar24 = 0;
  uVar27 = (ulong)(uint)lp->num_row_;
  if (lp->num_row_ < 1) {
    uVar27 = uVar24;
  }
  uVar21 = 0;
  uVar1 = 0;
  local_b4 = 0;
  uVar28 = 0;
  do {
    if (uVar27 == uVar24) {
      if (lp->sense_ == kMaximize) {
        pdVar9 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar24 = 0; uVar22 != uVar24; uVar24 = uVar24 + 1) {
          pdVar9[uVar24] = -pdVar9[uVar24];
        }
        pdVar9 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar22 = 0; uVar27 != uVar22; uVar22 = uVar22 + 1) {
          pdVar9[uVar22] = -pdVar9[uVar22];
        }
      }
      if ((int)uVar21 != 0) {
        highsLogDev(log_options,kInfo,"Of %d boxed rows: %d are basic and %d have basic slacks\n",
                    uVar21,(ulong)uVar1,(ulong)local_b4);
      }
      highs_solution->value_valid = true;
      highs_solution->dual_valid = true;
      highs_basis->valid = true;
      highs_basis->useful = true;
      HVar23 = kOk;
LAB_00270eba:
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&row_activity.super__Vector_base<double,_std::allocator<double>_>);
      return HVar23;
    }
    dVar32 = pdVar9[uVar24];
    dVar31 = pdVar10[uVar24];
    if ((-INFINITY < dVar32) || (dVar31 < INFINITY)) {
      iVar26 = (int)uVar28;
      if ((dVar32 == -INFINITY) || ((dVar31 == INFINITY || (dVar31 <= dVar32)))) {
        if (piVar7[iVar26] == 0) {
          pHVar8[uVar24] = kBasic;
          dVar31 = pdVar11[iVar26] - pdVar15[iVar26];
          dVar32 = 0.0;
        }
        else {
          dVar31 = pdVar11[iVar26] - pdVar15[iVar26];
          dVar32 = pdVar16[iVar26];
          cVar2 = pcVar17[iVar26];
          if (cVar2 == '<') {
            pHVar8[uVar24] = kUpper;
          }
          else if (cVar2 == '=') {
            pHVar8[uVar24] = (dVar32 < 0.0) * '\x02';
          }
          else {
            if (cVar2 != '>') {
              highsLogDev(log_options,kError,
                          "Error in IPX conversion: Row %2d: cannot handle constraint_type[%2d] = %d\n"
                          ,uVar24 & 0xffffffff,uVar28,(ulong)(uint)(int)cVar2);
              goto LAB_00270e31;
            }
            pHVar8[uVar24] = kLower;
          }
        }
        pdVar18[uVar24] = dVar31;
        pdVar19[uVar24] = dVar32;
      }
      else {
        dVar32 = pdVar12[(int)uVar30];
        if (piVar7[iVar26] == 0) {
          uVar1 = uVar1 + 1;
LAB_00270c32:
          dVar31 = 0.0;
          HVar29 = kBasic;
        }
        else {
          dVar31 = pdVar20[(int)uVar30];
          uVar6 = piVar13[(int)uVar30];
          if (uVar6 == 0xfffffffe) {
            HVar29 = kUpper;
          }
          else {
            if (uVar6 != 0xffffffff) {
              if (uVar6 != 0) {
                highsLogDev(log_options,kError,
                            "Error in IPX conversion: Row %2d (IPX row %2d) has unrecognised value ipx_col_status[%2d] = %d\n"
                            ,uVar24 & 0xffffffff,uVar28,(ulong)uVar30,(ulong)uVar6);
LAB_00270e31:
                highsLogDev(log_options,kError,"Bounds [%11.4g, %11.4g]\n",
                            (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar24],
                            (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar24]);
                highsLogDev(log_options,kError,
                            "Row %2d ipx_row_status[%2d] = %2d; s[%2d] = %11.4g; y[%2d] = %11.4g\n",
                            (ipx_solution->ipx_row_value).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar26],
                            (ipx_solution->ipx_row_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar26],uVar24 & 0xffffffff,uVar28,
                            (ulong)(uint)(ipx_solution->ipx_row_status).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[iVar26],uVar28);
                highsLogUser(log_options,kError,"Unrecognised ipx_row_status value from IPX\n",
                             uVar28);
LAB_00270eb7:
                HVar23 = kError;
                goto LAB_00270eba;
              }
              local_b4 = local_b4 + 1;
              goto LAB_00270c32;
            }
            HVar29 = kLower;
          }
        }
        uVar21 = (ulong)((int)uVar21 + 1);
        pHVar8[uVar24] = HVar29;
        pdVar18[uVar24] = dVar32;
        pdVar19[uVar24] = dVar31;
        uVar30 = uVar30 + 1;
      }
      uVar28 = (ulong)(iVar26 + 1);
    }
    else {
      pHVar8[uVar24] = kBasic;
      pdVar18[uVar24] =
           row_activity.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar24];
      pdVar19[uVar24] = 0.0;
    }
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

HighsStatus ipxBasicSolutionToHighsBasicSolution(
    const HighsLogOptions& log_options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const IpxSolution& ipx_solution, HighsBasis& highs_basis,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution and HighsBasis
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);
  highs_basis.col_status.resize(lp.num_col_);
  highs_basis.row_status.resize(lp.num_row_);

  const std::vector<double>& ipx_col_value = ipx_solution.ipx_col_value;
  const std::vector<double>& ipx_row_value = ipx_solution.ipx_row_value;
  const std::vector<double>& ipx_col_dual = ipx_solution.ipx_col_dual;
  const std::vector<double>& ipx_row_dual = ipx_solution.ipx_row_dual;
  const std::vector<ipx::Int>& ipx_col_status = ipx_solution.ipx_col_status;
  const std::vector<ipx::Int>& ipx_row_status = ipx_solution.ipx_row_status;

  // Set up meaningful names for values of ipx_col_status and ipx_row_status to
  // be used later in comparisons
  const ipx::Int ipx_basic = 0;
  const ipx::Int ipx_nonbasic_at_lb = -1;
  const ipx::Int ipx_nonbasic_at_ub = -2;
  const ipx::Int ipx_superbasic = -3;
  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  bool get_row_activities = ipx_solution.num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt num_basic_variables = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    bool unrecognised = false;
    if (ipx_col_status[col] == ipx_basic) {
      // Column is basic
      highs_basis.col_status[col] = HighsBasisStatus::kBasic;
      highs_solution.col_value[col] = ipx_col_value[col];
      highs_solution.col_dual[col] = 0;
    } else {
      // Column is nonbasic. Setting of ipx_col_status is consistent
      // with dual value for fixed columns
      if (ipx_col_status[col] == ipx_nonbasic_at_lb) {
        // Column is at lower bound
        highs_basis.col_status[col] = HighsBasisStatus::kLower;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_nonbasic_at_ub) {
        // Column is at upper bound
        highs_basis.col_status[col] = HighsBasisStatus::kUpper;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_superbasic) {
        // Column is superbasic
        highs_basis.col_status[col] = HighsBasisStatus::kZero;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else {
        unrecognised = true;
        highsLogDev(log_options, HighsLogType::kError,
                    "\nError in IPX conversion: Unrecognised value "
                    "ipx_col_status[%2" HIGHSINT_FORMAT
                    "] = "
                    "%" HIGHSINT_FORMAT "\n",
                    col, (HighsInt)ipx_col_status[col]);
      }
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.col_lower_[col],
                  lp.col_upper_[col]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Col %2" HIGHSINT_FORMAT " ipx_col_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; x[%2" HIGHSINT_FORMAT
                  "] = %11.4g; z[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  col, col, (HighsInt)ipx_col_status[col], col,
                  ipx_col_value[col], col, ipx_col_dual[col]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_col_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
      }
    }
    if (highs_basis.col_status[col] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  HighsInt ipx_row = 0;
  HighsInt ipx_slack = lp.num_col_;
  HighsInt num_boxed_rows = 0;
  HighsInt num_boxed_rows_basic = 0;
  HighsInt num_boxed_row_slacks_basic = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    bool unrecognised = false;
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    HighsInt this_ipx_row = ipx_row;
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so make it basic at its row activity
      highs_basis.row_status[row] = HighsBasisStatus::kBasic;
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
    } else {
      // Non-free row, so IPX will have it
      if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
        // Boxed row - look at its slack
        num_boxed_rows++;
        double slack_value = ipx_col_value[ipx_slack];
        double slack_dual = ipx_col_dual[ipx_slack];
        double value = slack_value;
        // @FlipRowDual -slack_dual became slack_dual
        double dual = slack_dual;
        if (ipx_row_status[ipx_row] == ipx_basic) {
          // Row is basic
          num_boxed_rows_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_basic) {
          // Slack is basic
          num_boxed_row_slacks_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_lb) {
          // Slack at lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub) {
          // Slack is at its upper bound
          assert(ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub);
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      " (IPX row %2" HIGHSINT_FORMAT
                      ") has "
                      "unrecognised value ipx_col_status[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, ipx_slack,
                      (HighsInt)ipx_col_status[ipx_slack]);
        }
        // Update the slack to be used for boxed rows
        ipx_slack++;
      } else if (ipx_row_status[ipx_row] == ipx_basic) {
        // Row is basic
        highs_basis.row_status[row] = HighsBasisStatus::kBasic;
        highs_solution.row_value[row] = rhs[ipx_row] - ipx_row_value[ipx_row];
        highs_solution.row_dual[row] = 0;
      } else {
        // Nonbasic row at fixed value, lower bound or upper bound
        assert(ipx_row_status[ipx_row] ==
               -1);  // const ipx::Int ipx_nonbasic_row = -1;
        double value = rhs[ipx_row] - ipx_row_value[ipx_row];
        // @FlipRowDual -ipx_row_dual[ipx_row]; became ipx_row_dual[ipx_row];
        double dual = ipx_row_dual[ipx_row];
        if (constraint_type[ipx_row] == '>') {
          // Row is at its lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '<') {
          // Row is at its upper bound
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '=') {
          // Row is at its fixed value: set HighsBasisStatus according
          // to sign of dual.
          //
          // Don't worry about maximization problems. IPX solves them
          // as minimizations with negated costs, so a negative dual
          // yields HighsBasisStatus::kUpper here, and dual signs are
          // then flipped below, so HighsBasisStatus::kUpper will have
          // corresponding positive dual.
          highs_basis.row_status[row] =
              dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      ": cannot handle "
                      "constraint_type[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, constraint_type[ipx_row]);
        }
      }
      // Update the IPX row index
      ipx_row++;
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.row_lower_[row],
                  lp.row_upper_[row]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Row %2" HIGHSINT_FORMAT " ipx_row_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; s[%2" HIGHSINT_FORMAT
                  "] = %11.4g; y[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  row, this_ipx_row, (HighsInt)ipx_row_status[this_ipx_row],
                  this_ipx_row, ipx_row_value[this_ipx_row], this_ipx_row,
                  ipx_row_dual[this_ipx_row]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_row_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (highs_basis.row_status[row] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  assert(num_basic_variables == lp.num_row_);
  assert(ipx_row == ipx_solution.num_row);
  assert(ipx_slack == ipx_solution.num_col);

  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  if (num_boxed_rows)
    highsLogDev(log_options, HighsLogType::kInfo,
                "Of %" HIGHSINT_FORMAT " boxed rows: %" HIGHSINT_FORMAT
                " are basic and %" HIGHSINT_FORMAT " have basic slacks\n",
                num_boxed_rows, num_boxed_rows_basic,
                num_boxed_row_slacks_basic);
  // Indicate that the primal solution, dual solution and basis are valid
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  highs_basis.valid = true;
  highs_basis.useful = true;
  return HighsStatus::kOk;
}